

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprIsInteger(Expr *p,int *pValue,Parse *pParse)

{
  u32 *puVar1;
  u8 uVar2;
  short sVar3;
  int iVar4;
  sqlite3_value *pMem;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  do {
    iVar7 = 0;
    if (p == (Expr *)0x0) {
LAB_001756be:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return iVar7;
      }
      __stack_chk_fail();
    }
    if ((p->flags & 0x800) != 0) {
      iVar4 = (p->u).iValue;
LAB_001756b8:
      *pValue = iVar4;
      iVar7 = 1;
      goto LAB_001756be;
    }
    uVar2 = p->op;
    if (uVar2 != 0xad) {
      if (uVar2 == 0x9d) {
        iVar7 = iVar4;
        if (((pParse != (Parse *)0x0) && (pParse->pVdbe != (Vdbe *)0x0)) &&
           ((pParse->db->flags & 0x800000) == 0)) {
          sVar3 = p->iColumn;
          uVar6 = 0x80000000;
          if (sVar3 < 0x20) {
            uVar6 = 1 << ((char)sVar3 - 1U & 0x1f);
          }
          puVar1 = &pParse->pVdbe->expmask;
          *puVar1 = *puVar1 | uVar6;
          pMem = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar3,(u8)pParse);
          if (pMem != (sqlite3_value *)0x0) {
            uVar6._0_2_ = pMem->flags;
            uVar6._2_1_ = pMem->enc;
            uVar6._3_1_ = pMem->eSubtype;
            iVar7 = 0;
            if ((0x50505050UL >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
              uVar5 = sqlite3VdbeIntValue(pMem);
              if (uVar5 < 0x80000000) {
                *pValue = (int)uVar5;
                iVar7 = 1;
              }
            }
            sqlite3ValueFree(pMem);
          }
        }
      }
      else if (uVar2 == 0xae) {
        local_2c = 0;
        iVar4 = sqlite3ExprIsInteger(p->pLeft,&local_2c,(Parse *)0x0);
        iVar7 = 0;
        if (iVar4 != 0) {
          iVar4 = -local_2c;
          goto LAB_001756b8;
        }
      }
      goto LAB_001756be;
    }
    p = p->pLeft;
    pParse = (Parse *)0x0;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsInteger(const Expr *p, int *pValue, Parse *pParse){
  int rc = 0;
  if( NEVER(p==0) ) return 0;  /* Used to only happen following on OOM */

  /* If an expression is an integer literal that fits in a signed 32-bit
  ** integer, then the EP_IntValue flag will have already been set */
  assert( p->op!=TK_INTEGER || (p->flags & EP_IntValue)!=0
           || sqlite3GetInt32(p->u.zToken, &rc)==0 );

  if( p->flags & EP_IntValue ){
    *pValue = p->u.iValue;
    return 1;
  }
  switch( p->op ){
    case TK_UPLUS: {
      rc = sqlite3ExprIsInteger(p->pLeft, pValue, 0);
      break;
    }
    case TK_UMINUS: {
      int v = 0;
      if( sqlite3ExprIsInteger(p->pLeft, &v, 0) ){
        assert( ((unsigned int)v)!=0x80000000 );
        *pValue = -v;
        rc = 1;
      }
      break;
    }
    case TK_VARIABLE: {
      sqlite3_value *pVal;
      if( pParse==0 ) break;
      if( NEVER(pParse->pVdbe==0) ) break;
      if( (pParse->db->flags & SQLITE_EnableQPSG)!=0 ) break;
      sqlite3VdbeSetVarmask(pParse->pVdbe, p->iColumn);
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare, p->iColumn,
                                      SQLITE_AFF_BLOB);
      if( pVal ){
        if( sqlite3_value_type(pVal)==SQLITE_INTEGER ){
          sqlite3_int64 vv = sqlite3_value_int64(pVal);
          if( vv == (vv & 0x7fffffff) ){ /* non-negative numbers only */
            *pValue = (int)vv;
            rc = 1;
          }
        }
        sqlite3ValueFree(pVal);
      }
      break;
    }
    default: break;
  }
  return rc;
}